

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_refine(lysp_ctx *ctx,lysp_stmt *stmt,lysp_refine **refines)

{
  ly_stmt lVar1;
  LY_ERR LVar2;
  lysp_refine *str_p;
  char *pcVar3;
  ly_ctx *local_b0;
  ly_ctx *local_a8;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  undefined8 *puStack_40;
  LY_ERR ret___1;
  char *p__;
  LY_ERR ret__;
  lysp_refine *rf;
  lysp_refine **refines_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    if (*refines == (lysp_refine *)0x0) {
      puStack_40 = (undefined8 *)malloc(0x58);
      if (puStack_40 == (undefined8 *)0x0) {
        if (ctx == (lysp_ctx *)0x0) {
          local_90 = (ly_ctx *)0x0;
        }
        else {
          local_90 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_90,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_refine");
        return LY_EMEM;
      }
      *puStack_40 = 1;
    }
    else {
      *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + 1;
      puStack_40 = (undefined8 *)
                   realloc(&(*refines)[-1].flags,*(long *)&(*refines)[-1].flags * 0x50 + 8);
      if (puStack_40 == (undefined8 *)0x0) {
        *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + -1;
        if (ctx == (lysp_ctx *)0x0) {
          local_88 = (ly_ctx *)0x0;
        }
        else {
          local_88 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_88,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_refine");
        return LY_EMEM;
      }
    }
    *refines = (lysp_refine *)(puStack_40 + 1);
    str_p = *refines + *(long *)&(*refines)[-1].flags + -1;
    memset(str_p,0,0x50);
    if (ctx == (lysp_ctx *)0x0) {
      local_98 = (ly_ctx *)0x0;
    }
    else {
      local_98 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ctx_local._4_4_ = lydict_insert(local_98,stmt->arg,0,&str_p->nodeid);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      for (_ret___3 = stmt->child; _ret___3 != (lysp_stmt *)0x0; _ret___3 = _ret___3->next) {
        lVar1 = _ret___3->kw;
        if (lVar1 == LY_STMT_CONFIG) {
          LVar2 = lysp_stmt_config(ctx,_ret___3,&str_p->flags,&str_p->exts);
        }
        else if (lVar1 == LY_STMT_DEFAULT) {
          LVar2 = lysp_stmt_qnames(ctx,_ret___3,&str_p->dflts,Y_STR_ARG,&str_p->exts);
        }
        else if (lVar1 == LY_STMT_DESCRIPTION) {
          LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->dsc,Y_STR_ARG,&str_p->exts);
        }
        else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
          LVar2 = lysp_stmt_ext(ctx,_ret___3,LY_STMT_REFINE,0,&str_p->exts);
        }
        else if (lVar1 == LY_STMT_IF_FEATURE) {
          if (*(byte *)&(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1][2].schema <
              2) {
            if (ctx == (lysp_ctx *)0x0) {
              local_a8 = (ly_ctx *)0x0;
            }
            else {
              local_a8 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            ly_vlog(local_a8,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ,"if-feature","refine");
            return LY_EVALID;
          }
          LVar2 = lysp_stmt_qnames(ctx,_ret___3,&str_p->iffeatures,Y_STR_ARG,&str_p->exts);
        }
        else if (lVar1 == LY_STMT_MANDATORY) {
          LVar2 = lysp_stmt_mandatory(ctx,_ret___3,&str_p->flags,&str_p->exts);
        }
        else if (lVar1 == LY_STMT_MAX_ELEMENTS) {
          LVar2 = lysp_stmt_maxelements(ctx,_ret___3,&str_p->max,&str_p->flags,&str_p->exts);
        }
        else if (lVar1 == LY_STMT_MIN_ELEMENTS) {
          LVar2 = lysp_stmt_minelements(ctx,_ret___3,&str_p->min,&str_p->flags,&str_p->exts);
        }
        else if (lVar1 == LY_STMT_MUST) {
          LVar2 = lysp_stmt_restrs(ctx,_ret___3,&str_p->musts);
        }
        else if (lVar1 == LY_STMT_PRESENCE) {
          LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->presence,Y_STR_ARG,&str_p->exts);
        }
        else {
          if (lVar1 != LY_STMT_REFERENCE) {
            if (ctx == (lysp_ctx *)0x0) {
              local_b0 = (ly_ctx *)0x0;
            }
            else {
              local_b0 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar3 = lyplg_ext_stmt2str(_ret___3->kw);
            ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,"refine");
            return LY_EVALID;
          }
          LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->ref,Y_STR_ARG,&str_p->exts);
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_refine(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_refine **refines)
{
    struct lysp_refine *rf;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *refines, rf, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &rf->nodeid));

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &rf->flags, &rf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &rf->dflts, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->dsc, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "refine");
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &rf->iffeatures, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_maxelements(ctx, child, &rf->max, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_minelements(ctx, child, &rf->min, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &rf->musts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &rf->flags, &rf->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->ref, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_PRESENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->presence, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_REFINE, 0, &rf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "refine");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}